

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O2

bool Am_Do_Events(bool wait)

{
  undefined7 in_register_00000039;
  Am_Time deadline;
  Am_Time local_20;
  Am_Time local_18;
  
  am_Handle_Timing_Events();
  Am_Time::~Am_Time(&local_18);
  Am_Update_All();
  if ((int)CONCAT71(in_register_00000039,wait) == 0) {
    Am_Drawonable::Process_Immediate_Event();
  }
  else {
    Am_Time::Now();
    Am_Time::operator+(&deadline,(unsigned_long)&local_20);
    Am_Time::~Am_Time(&local_20);
    Am_Drawonable::Process_Event(&deadline);
    Am_Time::~Am_Time(&deadline);
  }
  Am_Update_All();
  return Am_Main_Loop_Go;
}

Assistant:

bool
Am_Do_Events(bool wait)
{
  am_Handle_Timing_Events();
  Am_Update_All();
  if (wait) {
    Am_Time deadline = Am_Time::Now() + 100UL; // 100 milliseconds from now
    Am_Drawonable::Process_Event(deadline);
  } else
    Am_Drawonable::Process_Immediate_Event();
  Am_Update_All();
  return Am_Main_Loop_Go;
}